

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O2

void write_velocity(char *fn,qnode_ptr_t p)

{
  int __fd;
  long lVar1;
  int iVar2;
  long lVar3;
  float y;
  float x;
  int local_34;
  
  __fd = creat(fn,0x180);
  if (0 < __fd) {
    x = (float)p->sizx;
    y = (float)p->sizy;
    write(__fd,&x,4);
    write(__fd,&y,4);
    x = (float)(p->sizx + KERNEL_X * -2 + -0x12);
    y = (float)(p->sizy + KERNEL_Y * -2 + -0x12);
    write(__fd,&x,4);
    write(__fd,&y,4);
    x = (float)(KERNEL_X + 9);
    y = (float)(KERNEL_Y + 9);
    write(__fd,&x,4);
    write(__fd,&y,4);
    iVar2 = KERNEL_Y + 9;
    while (iVar2 < (p->sizy - KERNEL_Y) + -9) {
      local_34 = iVar2;
      for (lVar3 = (long)(KERNEL_X + 9); (int)lVar3 < (p->sizx - KERNEL_X) + -9; lVar3 = lVar3 + 1)
      {
        lVar1 = (long)p->res * (long)iVar2 + lVar3;
        x = (*p->flow_ptr)[lVar1].y;
        y = -(*p->flow_ptr)[lVar1].x;
        write(__fd,&x,4);
        write(__fd,&y,4);
      }
      iVar2 = local_34 + 1;
    }
    close(__fd);
    return;
  }
  error(6);
}

Assistant:

void write_velocity(fn,p)
qnode_ptr_t p ;
char *fn ;

{ extern int KERNEL_X, KERNEL_Y ;
  float x, y ;
  int i, j, fdf, bytes ;

  if ((fdf=creat(fn,0600)) < 1) {
    error(6) ;
  }

  x = p->sizx ;
  y = p->sizy ;
  write(fdf,&x,4) ;
  write(fdf,&y,4) ;

  x = ((p->sizx-KERNEL_X-NRADIUS)-(KERNEL_X+NRADIUS)+SKIP-1)/SKIP ;
  y = ((p->sizy-KERNEL_Y-NRADIUS)-(KERNEL_Y+NRADIUS)+SKIP-1)/SKIP ;
  write(fdf,&x,4);
  write(fdf,&y,4);

  x = (KERNEL_X+NRADIUS+SKIP-1)/SKIP ;
  y = (KERNEL_Y+NRADIUS+SKIP-1)/SKIP ;
  write(fdf,&x,4) ;
  write(fdf,&y,4) ;
  bytes = 24 ;

  for(i = KERNEL_Y + NRADIUS ; i < p->sizy - KERNEL_Y - NRADIUS ; i++) {
    for(j = KERNEL_X + NRADIUS ; j < p->sizx - KERNEL_X - NRADIUS ; j++) {
      x = (*p->flow_ptr)[p->res*i + j].y ;
      y = -(*p->flow_ptr)[p->res*i + j].x ;
      write(fdf,&x,4) ;
      write(fdf,&y,4) ;
      bytes += 8 ;
    }
  }
  close(fdf) ;
}